

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

int arkInterpSetDegree_Hermite(void *arkode_mem,ARKInterp interp,int degree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (arkode_mem == (void *)0x0) {
    return -0x15;
  }
  uVar3 = -degree;
  uVar2 = degree;
  if (degree < 1) {
    uVar2 = uVar3;
  }
  uVar1 = *interp->content;
  if (uVar2 != uVar1) {
    if (degree < 0) {
      degree = 5;
      if (uVar3 < 5) {
        degree = uVar3;
      }
      if ((int)uVar1 < degree) {
        degree = uVar1;
      }
    }
    else if (5 < (uint)degree) {
      arkProcessError((ARKodeMem)arkode_mem,-0x28,"ARKode","arkInterpSetDegree_Hermite",
                      "Illegal degree specified.",(ulong)uVar2,0);
      return -0x16;
    }
    *(int *)interp->content = degree;
  }
  return 0;
}

Assistant:

int arkInterpSetDegree_Hermite(void* arkode_mem, ARKInterp interp,
                               int degree)
{
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* if this degree is already stored, just return */
  if (abs(degree) == HINT_DEGREE(interp))  return(ARK_SUCCESS);

  /* on positive degree, check for allowable value and overwrite stored degree */
  if (degree >= 0) {
    if (degree > ARK_INTERP_MAX_DEGREE) {
      arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                      "arkInterpSetDegree_Hermite",
                      "Illegal degree specified.");
      return(ARK_ILL_INPUT);
    }

    HINT_DEGREE(interp) = degree;
    return(ARK_SUCCESS);
  }

  /* on negative degree, check for allowable value and update stored degree */
  degree = -degree;
  if (degree > ARK_INTERP_MAX_DEGREE) degree = ARK_INTERP_MAX_DEGREE;
  HINT_DEGREE(interp) = SUNMIN(HINT_DEGREE(interp), degree);

  return(ARK_SUCCESS);
}